

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O0

void ucm_addMapping(UCMTable *table,UCMapping *m,UChar32 *codePoints,uint8_t *bytes)

{
  int iVar1;
  uint32_t uVar2;
  anon_union_4_2_095b93d3_for_b aVar3;
  int8_t iVar4;
  int8_t iVar5;
  int8_t iVar6;
  UCMapping *pUVar7;
  UChar32 *pUVar8;
  uint8_t *puVar9;
  int local_38;
  int32_t idx;
  UChar32 c;
  UCMapping *tm;
  uint8_t *bytes_local;
  UChar32 *codePoints_local;
  UCMapping *m_local;
  UCMTable *table_local;
  
  if (table->mappingsCapacity <= table->mappingsLength) {
    if (table->mappingsCapacity == 0) {
      table->mappingsCapacity = 1000;
    }
    else {
      table->mappingsCapacity = table->mappingsCapacity * 10;
    }
    pUVar7 = (UCMapping *)uprv_realloc_63(table->mappings,(long)table->mappingsCapacity * 0xc);
    table->mappings = pUVar7;
    if (table->mappings == (UCMapping *)0x0) {
      fprintf(_stderr,"ucm error: unable to allocate %d UCMappings\n",
              (ulong)(uint)table->mappingsCapacity);
      exit(7);
    }
    if (table->reverseMap != (int32_t *)0x0) {
      uprv_free_63(table->reverseMap);
      table->reverseMap = (int32_t *)0x0;
    }
  }
  if (('\x01' < m->uLen) && (table->codePointsCapacity == 0)) {
    table->codePointsCapacity = 10000;
    pUVar8 = (UChar32 *)uprv_malloc_63((long)(table->codePointsCapacity << 2));
    table->codePoints = pUVar8;
    if (table->codePoints == (UChar32 *)0x0) {
      fprintf(_stderr,"ucm error: unable to allocate %d UChar32s\n",
              (ulong)(uint)table->codePointsCapacity);
      exit(7);
    }
  }
  if (('\x04' < m->bLen) && (table->bytesCapacity == 0)) {
    table->bytesCapacity = 10000;
    puVar9 = (uint8_t *)uprv_malloc_63((long)table->bytesCapacity);
    table->bytes = puVar9;
    if (table->bytes == (uint8_t *)0x0) {
      fprintf(_stderr,"ucm error: unable to allocate %d bytes\n",(ulong)(uint)table->bytesCapacity);
      exit(7);
    }
  }
  if ('\x01' < m->uLen) {
    iVar1 = table->codePointsLength;
    table->codePointsLength = (int)m->uLen + table->codePointsLength;
    if (table->codePointsCapacity < table->codePointsLength) {
      fprintf(_stderr,"ucm error: too many code points in multiple-code point mappings\n");
      exit(7);
    }
    memcpy(table->codePoints + iVar1,codePoints,(long)m->uLen << 2);
    m->u = iVar1;
  }
  if ('\x04' < m->bLen) {
    uVar2 = table->bytesLength;
    table->bytesLength = (int)m->bLen + table->bytesLength;
    if (table->bytesCapacity < table->bytesLength) {
      fprintf(_stderr,"ucm error: too many bytes in mappings with >4 charset bytes\n");
      exit(7);
    }
    memcpy(table->bytes + (int)uVar2,bytes,(long)m->bLen);
    (m->b).idx = uVar2;
  }
  for (local_38 = 0; local_38 < m->uLen; local_38 = local_38 + 1) {
    if (codePoints[local_38] < 0x10000) {
      if ((codePoints[local_38] & 0xfffff800U) == 0xd800) {
        table->unicodeMask = table->unicodeMask | 2;
      }
    }
    else {
      table->unicodeMask = table->unicodeMask | 1;
    }
  }
  if (m->f < '\0') {
    table->flagsType = table->flagsType | 2;
  }
  else {
    table->flagsType = table->flagsType | 1;
  }
  iVar1 = table->mappingsLength;
  table->mappingsLength = iVar1 + 1;
  pUVar7 = table->mappings + iVar1;
  aVar3 = m->b;
  pUVar7->u = m->u;
  pUVar7->b = aVar3;
  iVar4 = m->bLen;
  iVar5 = m->f;
  iVar6 = m->moveFlag;
  pUVar7->uLen = m->uLen;
  pUVar7->bLen = iVar4;
  pUVar7->f = iVar5;
  pUVar7->moveFlag = iVar6;
  table->isSorted = '\0';
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucm_addMapping(UCMTable *table,
               UCMapping *m,
               UChar32 codePoints[UCNV_EXT_MAX_UCHARS],
               uint8_t bytes[UCNV_EXT_MAX_BYTES]) {
    UCMapping *tm;
    UChar32 c;
    int32_t idx;

    if(table->mappingsLength>=table->mappingsCapacity) {
        /* make the mappings array larger */
        if(table->mappingsCapacity==0) {
            table->mappingsCapacity=1000;
        } else {
            table->mappingsCapacity*=10;
        }
        table->mappings=(UCMapping *)uprv_realloc(table->mappings,
                                             table->mappingsCapacity*sizeof(UCMapping));
        if(table->mappings==NULL) {
            fprintf(stderr, "ucm error: unable to allocate %d UCMappings\n",
                            (int)table->mappingsCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        if(table->reverseMap!=NULL) {
            /* the reverseMap must be reallocated in a new sort */
            uprv_free(table->reverseMap);
            table->reverseMap=NULL;
        }
    }

    if(m->uLen>1 && table->codePointsCapacity==0) {
        table->codePointsCapacity=10000;
        table->codePoints=(UChar32 *)uprv_malloc(table->codePointsCapacity*4);
        if(table->codePoints==NULL) {
            fprintf(stderr, "ucm error: unable to allocate %d UChar32s\n",
                            (int)table->codePointsCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
    }

    if(m->bLen>4 && table->bytesCapacity==0) {
        table->bytesCapacity=10000;
        table->bytes=(uint8_t *)uprv_malloc(table->bytesCapacity);
        if(table->bytes==NULL) {
            fprintf(stderr, "ucm error: unable to allocate %d bytes\n",
                            (int)table->bytesCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
    }

    if(m->uLen>1) {
        idx=table->codePointsLength;
        table->codePointsLength+=m->uLen;
        if(table->codePointsLength>table->codePointsCapacity) {
            fprintf(stderr, "ucm error: too many code points in multiple-code point mappings\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        uprv_memcpy(table->codePoints+idx, codePoints, (size_t)m->uLen*4);
        m->u=idx;
    }

    if(m->bLen>4) {
        idx=table->bytesLength;
        table->bytesLength+=m->bLen;
        if(table->bytesLength>table->bytesCapacity) {
            fprintf(stderr, "ucm error: too many bytes in mappings with >4 charset bytes\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        uprv_memcpy(table->bytes+idx, bytes, m->bLen);
        m->b.idx=idx;
    }

    /* set unicodeMask */
    for(idx=0; idx<m->uLen; ++idx) {
        c=codePoints[idx];
        if(c>=0x10000) {
            table->unicodeMask|=UCNV_HAS_SUPPLEMENTARY; /* there are supplementary code points */
        } else if(U_IS_SURROGATE(c)) {
            table->unicodeMask|=UCNV_HAS_SURROGATES;    /* there are surrogate code points */
        }
    }

    /* set flagsType */
    if(m->f<0) {
        table->flagsType|=UCM_FLAGS_IMPLICIT;
    } else {
        table->flagsType|=UCM_FLAGS_EXPLICIT;
    }

    tm=table->mappings+table->mappingsLength++;
    uprv_memcpy(tm, m, sizeof(UCMapping));

    table->isSorted=FALSE;
}